

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void * Fossilize::build_pnext_chain
                 (VulkanFeatures *features,uint32_t api_version,char **enabled_extensions,
                 uint32_t extension_count)

{
  char *pcVar1;
  size_type sVar2;
  bool bVar3;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar4;
  allocator local_2c11;
  string local_2c10 [37];
  undefined1 local_2beb;
  byte local_2bea;
  bool supports_extension_101;
  bool is_minimum_api_version_101;
  allocator local_2bc1;
  string local_2bc0 [37];
  undefined1 local_2b9b;
  byte local_2b9a;
  bool supports_extension_100;
  bool is_minimum_api_version_100;
  allocator local_2b71;
  string local_2b70 [37];
  undefined1 local_2b4b;
  byte local_2b4a;
  bool supports_extension_99;
  bool is_minimum_api_version_99;
  allocator local_2b21;
  string local_2b20 [37];
  undefined1 local_2afb;
  byte local_2afa;
  bool supports_extension_98;
  bool is_minimum_api_version_98;
  allocator local_2ad1;
  string local_2ad0 [37];
  undefined1 local_2aab;
  byte local_2aaa;
  bool supports_extension_97;
  bool is_minimum_api_version_97;
  allocator local_2a81;
  string local_2a80 [37];
  undefined1 local_2a5b;
  byte local_2a5a;
  bool supports_extension_96;
  bool is_minimum_api_version_96;
  allocator local_2a31;
  string local_2a30 [37];
  undefined1 local_2a0b;
  byte local_2a0a;
  bool supports_extension_95;
  bool is_minimum_api_version_95;
  allocator local_29e1;
  string local_29e0 [37];
  undefined1 local_29bb;
  byte local_29ba;
  bool supports_extension_94;
  bool is_minimum_api_version_94;
  allocator local_2991;
  string local_2990 [37];
  undefined1 local_296b;
  byte local_296a;
  bool supports_extension_93;
  bool is_minimum_api_version_93;
  allocator local_2941;
  string local_2940 [37];
  undefined1 local_291b;
  byte local_291a;
  bool supports_extension_92;
  bool is_minimum_api_version_92;
  allocator local_28f1;
  string local_28f0 [37];
  undefined1 local_28cb;
  byte local_28ca;
  bool supports_extension_91;
  bool is_minimum_api_version_91;
  allocator local_28a1;
  string local_28a0 [37];
  undefined1 local_287b;
  byte local_287a;
  bool supports_extension_90;
  bool is_minimum_api_version_90;
  allocator local_2851;
  string local_2850 [37];
  undefined1 local_282b;
  byte local_282a;
  bool supports_extension_89;
  bool is_minimum_api_version_89;
  allocator local_2801;
  string local_2800 [37];
  undefined1 local_27db;
  byte local_27da;
  bool supports_extension_88;
  bool is_minimum_api_version_88;
  allocator local_27b1;
  string local_27b0 [37];
  undefined1 local_278b;
  byte local_278a;
  bool supports_extension_87;
  bool is_minimum_api_version_87;
  allocator local_2761;
  string local_2760 [37];
  undefined1 local_273b;
  byte local_273a;
  bool supports_extension_86;
  bool is_minimum_api_version_86;
  allocator local_2711;
  string local_2710 [37];
  undefined1 local_26eb;
  byte local_26ea;
  allocator local_26e9;
  string local_26e8 [5];
  bool supports_extension_85;
  bool is_minimum_api_version_85;
  allocator local_26c1;
  string local_26c0 [37];
  byte local_269b;
  byte local_269a;
  bool supports_extension_84;
  bool is_minimum_api_version_84;
  allocator local_2671;
  string local_2670 [37];
  undefined1 local_264b;
  byte local_264a;
  bool supports_extension_83;
  bool is_minimum_api_version_83;
  allocator local_2621;
  string local_2620 [37];
  undefined1 local_25fb;
  byte local_25fa;
  bool supports_extension_82;
  bool is_minimum_api_version_82;
  allocator local_25d1;
  string local_25d0 [37];
  undefined1 local_25ab;
  byte local_25aa;
  bool supports_extension_81;
  bool is_minimum_api_version_81;
  allocator local_2581;
  string local_2580 [37];
  undefined1 local_255b;
  byte local_255a;
  bool supports_extension_80;
  bool is_minimum_api_version_80;
  allocator local_2531;
  string local_2530 [37];
  undefined1 local_250b;
  byte local_250a;
  bool supports_extension_79;
  bool is_minimum_api_version_79;
  allocator local_24e1;
  string local_24e0 [37];
  undefined1 local_24bb;
  byte local_24ba;
  bool supports_extension_78;
  bool is_minimum_api_version_78;
  allocator local_2491;
  string local_2490 [37];
  undefined1 local_246b;
  byte local_246a;
  bool supports_extension_77;
  bool is_minimum_api_version_77;
  allocator local_2441;
  string local_2440 [37];
  undefined1 local_241b;
  byte local_241a;
  bool supports_extension_76;
  bool is_minimum_api_version_76;
  allocator local_23f1;
  string local_23f0 [37];
  undefined1 local_23cb;
  byte local_23ca;
  bool supports_extension_75;
  bool is_minimum_api_version_75;
  allocator local_23a1;
  string local_23a0 [37];
  undefined1 local_237b;
  byte local_237a;
  bool supports_extension_74;
  bool is_minimum_api_version_74;
  allocator local_2351;
  string local_2350 [37];
  undefined1 local_232b;
  byte local_232a;
  bool supports_extension_73;
  bool is_minimum_api_version_73;
  allocator local_2301;
  string local_2300 [37];
  undefined1 local_22db;
  byte local_22da;
  bool supports_extension_72;
  bool is_minimum_api_version_72;
  allocator local_22b1;
  string local_22b0 [37];
  undefined1 local_228b;
  byte local_228a;
  bool supports_extension_71;
  bool is_minimum_api_version_71;
  allocator local_2261;
  string local_2260 [37];
  undefined1 local_223b;
  byte local_223a;
  bool supports_extension_70;
  bool is_minimum_api_version_70;
  allocator local_2211;
  string local_2210 [37];
  undefined1 local_21eb;
  byte local_21ea;
  bool supports_extension_69;
  bool is_minimum_api_version_69;
  allocator local_21c1;
  string local_21c0 [37];
  undefined1 local_219b;
  byte local_219a;
  bool supports_extension_68;
  bool is_minimum_api_version_68;
  allocator local_2171;
  string local_2170 [37];
  undefined1 local_214b;
  byte local_214a;
  bool supports_extension_67;
  bool is_minimum_api_version_67;
  allocator local_2121;
  string local_2120 [37];
  undefined1 local_20fb;
  byte local_20fa;
  bool supports_extension_66;
  bool is_minimum_api_version_66;
  allocator local_20d1;
  string local_20d0 [37];
  undefined1 local_20ab;
  byte local_20aa;
  bool supports_extension_65;
  bool is_minimum_api_version_65;
  allocator local_2081;
  string local_2080 [37];
  undefined1 local_205b;
  byte local_205a;
  bool supports_extension_64;
  bool is_minimum_api_version_64;
  allocator local_2031;
  string local_2030 [37];
  undefined1 local_200b;
  byte local_200a;
  bool supports_extension_63;
  bool is_minimum_api_version_63;
  allocator local_1fe1;
  string local_1fe0 [37];
  undefined1 local_1fbb;
  byte local_1fba;
  bool supports_extension_62;
  bool is_minimum_api_version_62;
  allocator local_1f91;
  string local_1f90 [37];
  undefined1 local_1f6b;
  byte local_1f6a;
  bool supports_extension_61;
  bool is_minimum_api_version_61;
  allocator local_1f41;
  string local_1f40 [37];
  undefined1 local_1f1b;
  byte local_1f1a;
  bool supports_extension_60;
  bool is_minimum_api_version_60;
  allocator local_1ef1;
  string local_1ef0 [37];
  undefined1 local_1ecb;
  byte local_1eca;
  bool supports_extension_59;
  bool is_minimum_api_version_59;
  allocator local_1ea1;
  string local_1ea0 [37];
  undefined1 local_1e7b;
  byte local_1e7a;
  bool supports_extension_58;
  bool is_minimum_api_version_58;
  allocator local_1e51;
  string local_1e50 [37];
  undefined1 local_1e2b;
  byte local_1e2a;
  bool supports_extension_57;
  bool is_minimum_api_version_57;
  allocator local_1e01;
  string local_1e00 [37];
  undefined1 local_1ddb;
  byte local_1dda;
  bool supports_extension_56;
  bool is_minimum_api_version_56;
  allocator local_1db1;
  string local_1db0 [37];
  undefined1 local_1d8b;
  byte local_1d8a;
  bool supports_extension_55;
  bool is_minimum_api_version_55;
  allocator local_1d61;
  string local_1d60 [37];
  undefined1 local_1d3b;
  byte local_1d3a;
  bool supports_extension_54;
  bool is_minimum_api_version_54;
  allocator local_1d11;
  string local_1d10 [37];
  undefined1 local_1ceb;
  byte local_1cea;
  allocator local_1ce9;
  string local_1ce8 [5];
  bool supports_extension_53;
  bool is_minimum_api_version_53;
  allocator local_1cc1;
  string local_1cc0 [37];
  byte local_1c9b;
  byte local_1c9a;
  bool supports_extension_52;
  bool is_minimum_api_version_52;
  allocator local_1c71;
  string local_1c70 [37];
  undefined1 local_1c4b;
  byte local_1c4a;
  bool supports_extension_51;
  bool is_minimum_api_version_51;
  allocator local_1c21;
  string local_1c20 [37];
  undefined1 local_1bfb;
  byte local_1bfa;
  bool supports_extension_50;
  bool is_minimum_api_version_50;
  allocator local_1bd1;
  string local_1bd0 [37];
  undefined1 local_1bab;
  byte local_1baa;
  bool supports_extension_49;
  bool is_minimum_api_version_49;
  allocator local_1b81;
  string local_1b80 [37];
  undefined1 local_1b5b;
  byte local_1b5a;
  bool supports_extension_48;
  bool is_minimum_api_version_48;
  allocator local_1b31;
  string local_1b30 [37];
  undefined1 local_1b0b;
  byte local_1b0a;
  bool supports_extension_47;
  bool is_minimum_api_version_47;
  allocator local_1ae1;
  string local_1ae0 [37];
  undefined1 local_1abb;
  byte local_1aba;
  allocator local_1ab9;
  string local_1ab8 [5];
  bool supports_extension_46;
  bool is_minimum_api_version_46;
  allocator local_1a91;
  string local_1a90 [37];
  byte local_1a6b;
  byte local_1a6a;
  bool supports_extension_45;
  bool is_minimum_api_version_45;
  allocator local_1a41;
  string local_1a40 [37];
  undefined1 local_1a1b;
  byte local_1a1a;
  bool supports_extension_44;
  bool is_minimum_api_version_44;
  allocator local_19f1;
  string local_19f0 [37];
  undefined1 local_19cb;
  byte local_19ca;
  bool supports_extension_43;
  bool is_minimum_api_version_43;
  allocator local_19a1;
  string local_19a0 [37];
  undefined1 local_197b;
  byte local_197a;
  bool supports_extension_42;
  bool is_minimum_api_version_42;
  allocator local_1951;
  string local_1950 [37];
  undefined1 local_192b;
  byte local_192a;
  bool supports_extension_41;
  bool is_minimum_api_version_41;
  allocator local_1901;
  string local_1900 [37];
  undefined1 local_18db;
  byte local_18da;
  bool supports_extension_40;
  bool is_minimum_api_version_40;
  allocator local_18b1;
  string local_18b0 [37];
  undefined1 local_188b;
  byte local_188a;
  bool supports_extension_39;
  bool is_minimum_api_version_39;
  allocator local_1861;
  string local_1860 [37];
  undefined1 local_183b;
  byte local_183a;
  bool supports_extension_38;
  bool is_minimum_api_version_38;
  allocator local_1811;
  string local_1810 [37];
  undefined1 local_17eb;
  byte local_17ea;
  bool supports_extension_37;
  bool is_minimum_api_version_37;
  allocator local_17c1;
  string local_17c0 [37];
  undefined1 local_179b;
  byte local_179a;
  bool supports_extension_36;
  bool is_minimum_api_version_36;
  allocator local_1771;
  string local_1770 [37];
  undefined1 local_174b;
  byte local_174a;
  bool supports_extension_35;
  bool is_minimum_api_version_35;
  allocator local_1721;
  string local_1720 [37];
  undefined1 local_16fb;
  byte local_16fa;
  allocator local_16f9;
  string local_16f8 [5];
  bool supports_extension_34;
  bool is_minimum_api_version_34;
  allocator local_16d1;
  string local_16d0 [37];
  byte local_16ab;
  byte local_16aa;
  bool supports_extension_33;
  bool is_minimum_api_version_33;
  allocator local_1681;
  string local_1680 [37];
  undefined1 local_165b;
  byte local_165a;
  bool supports_extension_32;
  bool is_minimum_api_version_32;
  allocator local_1631;
  string local_1630 [37];
  undefined1 local_160b;
  byte local_160a;
  bool supports_extension_31;
  bool is_minimum_api_version_31;
  allocator local_15e1;
  string local_15e0 [37];
  undefined1 local_15bb;
  byte local_15ba;
  bool supports_extension_30;
  bool is_minimum_api_version_30;
  allocator local_1591;
  string local_1590 [37];
  undefined1 local_156b;
  byte local_156a;
  allocator local_1569;
  string local_1568 [5];
  bool supports_extension_29;
  bool is_minimum_api_version_29;
  allocator local_1541;
  string local_1540 [37];
  byte local_151b;
  byte local_151a;
  bool supports_extension_28;
  bool is_minimum_api_version_28;
  allocator local_14f1;
  string local_14f0 [37];
  undefined1 local_14cb;
  byte local_14ca;
  bool supports_extension_27;
  bool is_minimum_api_version_27;
  allocator local_14a1;
  string local_14a0 [37];
  undefined1 local_147b;
  byte local_147a;
  bool supports_extension_26;
  bool is_minimum_api_version_26;
  allocator local_1451;
  string local_1450 [37];
  undefined1 local_142b;
  byte local_142a;
  bool supports_extension_25;
  bool is_minimum_api_version_25;
  allocator local_1401;
  string local_1400 [37];
  undefined1 local_13db;
  byte local_13da;
  bool supports_extension_24;
  bool is_minimum_api_version_24;
  allocator local_13b1;
  string local_13b0 [37];
  undefined1 local_138b;
  byte local_138a;
  bool supports_extension_23;
  bool is_minimum_api_version_23;
  allocator local_1361;
  string local_1360 [37];
  undefined1 local_133b;
  byte local_133a;
  bool supports_extension_22;
  bool is_minimum_api_version_22;
  allocator local_1311;
  string local_1310 [37];
  undefined1 local_12eb;
  byte local_12ea;
  bool supports_extension_21;
  bool is_minimum_api_version_21;
  allocator local_12c1;
  string local_12c0 [37];
  undefined1 local_129b;
  byte local_129a;
  bool supports_extension_20;
  bool is_minimum_api_version_20;
  allocator local_1271;
  string local_1270 [37];
  undefined1 local_124b;
  byte local_124a;
  bool supports_extension_19;
  bool is_minimum_api_version_19;
  allocator local_1221;
  string local_1220 [37];
  undefined1 local_11fb;
  byte local_11fa;
  bool supports_extension_18;
  bool is_minimum_api_version_18;
  allocator local_11d1;
  string local_11d0 [37];
  undefined1 local_11ab;
  byte local_11aa;
  bool supports_extension_17;
  bool is_minimum_api_version_17;
  allocator local_1181;
  string local_1180 [37];
  undefined1 local_115b;
  byte local_115a;
  bool supports_extension_16;
  bool is_minimum_api_version_16;
  allocator local_1131;
  string local_1130 [37];
  undefined1 local_110b;
  byte local_110a;
  bool supports_extension_15;
  bool is_minimum_api_version_15;
  allocator local_10e1;
  string local_10e0 [37];
  undefined1 local_10bb;
  byte local_10ba;
  bool supports_extension_14;
  bool is_minimum_api_version_14;
  allocator local_1091;
  string local_1090 [37];
  undefined1 local_106b;
  byte local_106a;
  bool supports_extension_13;
  bool is_minimum_api_version_13;
  allocator local_1041;
  string local_1040 [37];
  undefined1 local_101b;
  byte local_101a;
  bool supports_extension_12;
  bool is_minimum_api_version_12;
  allocator local_ff1;
  string local_ff0 [37];
  undefined1 local_fcb;
  byte local_fca;
  bool supports_extension_11;
  bool is_minimum_api_version_11;
  allocator local_fa1;
  string local_fa0 [37];
  undefined1 local_f7b;
  byte local_f7a;
  bool supports_extension_10;
  bool is_minimum_api_version_10;
  allocator local_f51;
  string local_f50 [37];
  undefined1 local_f2b;
  byte local_f2a;
  bool supports_extension_9;
  bool is_minimum_api_version_9;
  allocator local_f01;
  string local_f00 [37];
  undefined1 local_edb;
  byte local_eda;
  bool supports_extension_8;
  bool is_minimum_api_version_8;
  allocator local_eb1;
  string local_eb0 [37];
  undefined1 local_e8b;
  byte local_e8a;
  bool supports_extension_7;
  bool is_minimum_api_version_7;
  allocator local_e61;
  string local_e60 [37];
  undefined1 local_e3b;
  byte local_e3a;
  bool supports_extension_6;
  bool is_minimum_api_version_6;
  allocator local_e11;
  string local_e10 [37];
  undefined1 local_deb;
  byte local_dea;
  bool supports_extension_5;
  bool is_minimum_api_version_5;
  allocator local_dc1;
  string local_dc0 [37];
  undefined1 local_d9b;
  byte local_d9a;
  bool supports_extension_4;
  bool is_minimum_api_version_4;
  allocator local_d71;
  string local_d70 [37];
  undefined1 local_d4b;
  byte local_d4a;
  bool supports_extension_3;
  bool is_minimum_api_version_3;
  allocator local_d21;
  string local_d20 [37];
  undefined1 local_cfb;
  byte local_cfa;
  bool supports_extension_2;
  bool is_minimum_api_version_2;
  allocator local_cd1;
  string local_cd0 [37];
  undefined1 local_cab;
  byte local_caa;
  bool supports_extension_1;
  bool is_minimum_api_version_1;
  allocator local_c81;
  string local_c80 [38];
  undefined1 local_c5a;
  byte local_c59;
  bool supports_extension;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  _Stack_c58;
  bool is_minimum_api_version;
  undefined1 local_c50;
  allocator local_c41;
  string local_c40 [36];
  uint local_c1c;
  undefined1 local_c18 [4];
  uint32_t i;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabled_extension_set;
  void **ppNext;
  void *pNext;
  uint32_t local_24;
  char **ppcStack_20;
  uint32_t extension_count_local;
  char **enabled_extensions_local;
  VulkanFeatures *pVStack_10;
  uint32_t api_version_local;
  VulkanFeatures *features_local;
  
  local_24 = extension_count;
  ppcStack_20 = enabled_extensions;
  enabled_extensions_local._4_4_ = api_version;
  pVStack_10 = features;
  memset(&pNext,0,0xba8);
  memcpy(pVStack_10,&pNext,0xba8);
  ppNext = (void **)0x0;
  enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18);
  for (local_c1c = 0; local_c1c < local_24; local_c1c = local_c1c + 1) {
    pcVar1 = ppcStack_20[local_c1c];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c40,pcVar1,&local_c41);
    pVar4 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c18,(value_type *)local_c40);
    _Stack_c58._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_c50 = pVar4.second;
    std::__cxx11::string::~string(local_c40);
    std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  }
  local_c59 = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c80,"VK_KHR_16bit_storage",&local_c81);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_c80);
  std::__cxx11::string::~string(local_c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
  if (((local_c59 & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->storage_16bit).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_16BIT_STORAGE_FEATURES;
    ppNext = (void **)pVStack_10;
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt = (_Hash_node_base *)pVStack_10;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->storage_16bit).pNext;
  }
  local_caa = 0x3fffff < enabled_extensions_local._4_4_;
  local_c5a = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd0,"VK_KHR_multiview",&local_cd1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_cd0);
  std::__cxx11::string::~string(local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  if (((local_caa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->multiview).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTIVIEW_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->multiview;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->multiview;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->multiview).pNext;
  }
  local_cfa = 0x3fffff < enabled_extensions_local._4_4_;
  local_cab = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d20,"VK_KHR_variable_pointers",&local_d21);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_d20);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  if (((local_cfa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->variable_pointers).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VARIABLE_POINTERS_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->variable_pointers;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->variable_pointers;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->variable_pointers).pNext;
  }
  local_d4a = 0x3fffff < enabled_extensions_local._4_4_;
  local_cfb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d70,"VK_KHR_sampler_ycbcr_conversion",&local_d71);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_d70);
  std::__cxx11::string::~string(local_d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  if (((local_d4a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->ycbcr_conversion).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SAMPLER_YCBCR_CONVERSION_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ycbcr_conversion;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ycbcr_conversion;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->ycbcr_conversion).pNext;
  }
  local_d9a = 0x400fff < enabled_extensions_local._4_4_;
  local_d4b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc0,"VK_KHR_shader_draw_parameters",&local_dc1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_dc0);
  std::__cxx11::string::~string(local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
  if (((local_d9a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->draw_parameters).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_DRAW_PARAMETERS_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->draw_parameters;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->draw_parameters;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->draw_parameters).pNext;
  }
  local_dea = 0x3fffff < enabled_extensions_local._4_4_;
  local_d9b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e10,"VK_KHR_8bit_storage",&local_e11);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_e10);
  std::__cxx11::string::~string(local_e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_e11);
  if (((local_dea & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->storage_8bit).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_8BIT_STORAGE_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->storage_8bit;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->storage_8bit;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->storage_8bit).pNext
    ;
  }
  local_e3a = 0x3fffff < enabled_extensions_local._4_4_;
  local_deb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e60,"VK_KHR_shader_atomic_int64",&local_e61);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_e60);
  std::__cxx11::string::~string(local_e60);
  std::allocator<char>::~allocator((allocator<char> *)&local_e61);
  if (((local_e3a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->atomic_int64).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_INT64_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->atomic_int64;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->atomic_int64;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->atomic_int64).pNext
    ;
  }
  local_e8a = 0x3fffff < enabled_extensions_local._4_4_;
  local_e3b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb0,"VK_KHR_shader_float16_int8",&local_eb1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_eb0);
  std::__cxx11::string::~string(local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  if (((local_e8a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->float16_int8).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FLOAT16_INT8_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->float16_int8;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->float16_int8;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->float16_int8).pNext
    ;
  }
  local_eda = 0x3fffff < enabled_extensions_local._4_4_;
  local_e8b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f00,"VK_EXT_descriptor_indexing",&local_f01);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_f00);
  std::__cxx11::string::~string(local_f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_f01);
  if (((local_eda & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->descriptor_indexing).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->descriptor_indexing;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->descriptor_indexing;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->descriptor_indexing).pNext;
  }
  local_f2a = 0x3fffff < enabled_extensions_local._4_4_;
  local_edb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f50,"VK_KHR_vulkan_memory_model",&local_f51);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_f50);
  std::__cxx11::string::~string(local_f50);
  std::allocator<char>::~allocator((allocator<char> *)&local_f51);
  if (((local_f2a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->memory_model).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_MEMORY_MODEL_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->memory_model;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->memory_model;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->memory_model).pNext
    ;
  }
  local_f7a = 0x3fffff < enabled_extensions_local._4_4_;
  local_f2b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fa0,"VK_KHR_uniform_buffer_standard_layout",&local_fa1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_fa0);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  if (((local_f7a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->ubo_standard_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_UNIFORM_BUFFER_STANDARD_LAYOUT_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ubo_standard_layout;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ubo_standard_layout;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->ubo_standard_layout).pNext;
  }
  local_fca = 0x400fff < enabled_extensions_local._4_4_;
  local_f7b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ff0,"VK_KHR_shader_subgroup_extended_types",&local_ff1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_ff0);
  std::__cxx11::string::~string(local_ff0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
  if (((local_fca & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->subgroup_extended_types).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SUBGROUP_EXTENDED_TYPES_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->subgroup_extended_types;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->subgroup_extended_types;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->subgroup_extended_types).pNext;
  }
  local_101a = 0x3fffff < enabled_extensions_local._4_4_;
  local_fcb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1040,"VK_KHR_separate_depth_stencil_layouts",&local_1041);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1040);
  std::__cxx11::string::~string(local_1040);
  std::allocator<char>::~allocator((allocator<char> *)&local_1041);
  if (((local_101a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->separate_ds_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SEPARATE_DEPTH_STENCIL_LAYOUTS_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->separate_ds_layout;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->separate_ds_layout;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->separate_ds_layout).pNext;
  }
  local_106a = 0x3fffff < enabled_extensions_local._4_4_;
  local_101b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1090,"VK_KHR_buffer_device_address",&local_1091);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1090);
  std::__cxx11::string::~string(local_1090);
  std::allocator<char>::~allocator((allocator<char> *)&local_1091);
  if (((local_106a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->buffer_device_address).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->buffer_device_address;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->buffer_device_address;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->buffer_device_address).pNext;
  }
  local_10ba = 0x3fffff < enabled_extensions_local._4_4_;
  local_106b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10e0,"VK_KHR_shader_clock",&local_10e1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_10e0);
  std::__cxx11::string::~string(local_10e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e1);
  if (((local_10ba & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_clock).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_CLOCK_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_clock;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_clock;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->shader_clock).pNext
    ;
  }
  local_110a = 0x3fffff < enabled_extensions_local._4_4_;
  local_10bb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1130,"VK_KHR_fragment_shading_rate",&local_1131);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1130);
  std::__cxx11::string::~string(local_1130);
  std::allocator<char>::~allocator((allocator<char> *)&local_1131);
  if (((local_110a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->fragment_shading_rate).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->fragment_shading_rate;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->fragment_shading_rate;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->fragment_shading_rate).pNext;
  }
  local_115a = 0x3fffff < enabled_extensions_local._4_4_;
  local_110b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1180,"VK_KHR_ray_tracing_pipeline",&local_1181);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1180);
  std::__cxx11::string::~string(local_1180);
  std::allocator<char>::~allocator((allocator<char> *)&local_1181);
  if (((local_115a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->ray_tracing_pipeline).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_PIPELINE_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ray_tracing_pipeline;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ray_tracing_pipeline;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->ray_tracing_pipeline).pNext;
  }
  local_11aa = 0x3fffff < enabled_extensions_local._4_4_;
  local_115b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11d0,"VK_KHR_acceleration_structure",&local_11d1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_11d0);
  std::__cxx11::string::~string(local_11d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
  if (((local_11aa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->acceleration_structure).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ACCELERATION_STRUCTURE_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->acceleration_structure;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->acceleration_structure;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->acceleration_structure).pNext;
  }
  local_11fa = 0x3fffff < enabled_extensions_local._4_4_;
  local_11ab = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1220,"VK_KHR_ray_query",&local_1221);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1220);
  std::__cxx11::string::~string(local_1220);
  std::allocator<char>::~allocator((allocator<char> *)&local_1221);
  if (((local_11fa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->ray_query).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_QUERY_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ray_query;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ray_query;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->ray_query).pNext;
  }
  local_124a = 0x3fffff < enabled_extensions_local._4_4_;
  local_11fb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1270,"VK_KHR_workgroup_memory_explicit_layout",&local_1271);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1270);
  std::__cxx11::string::~string(local_1270);
  std::allocator<char>::~allocator((allocator<char> *)&local_1271);
  if (((local_124a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->workgroup_memory_explicit_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_WORKGROUP_MEMORY_EXPLICIT_LAYOUT_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->workgroup_memory_explicit_layout;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->workgroup_memory_explicit_layout;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->workgroup_memory_explicit_layout).pNext;
  }
  local_129a = 0x3fffff < enabled_extensions_local._4_4_;
  local_124b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12c0,"VK_KHR_shader_integer_dot_product",&local_12c1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_12c0);
  std::__cxx11::string::~string(local_12c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12c1);
  if (((local_129a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_integer_dot_product).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_INTEGER_DOT_PRODUCT_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_integer_dot_product;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_integer_dot_product;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_integer_dot_product).pNext;
  }
  local_12ea = 0x3fffff < enabled_extensions_local._4_4_;
  local_129b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1310,"VK_KHR_synchronization2",&local_1311);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1310);
  std::__cxx11::string::~string(local_1310);
  std::allocator<char>::~allocator((allocator<char> *)&local_1311);
  if (((local_12ea & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->synchronization2).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SYNCHRONIZATION_2_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->synchronization2;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->synchronization2;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->synchronization2).pNext;
  }
  local_133a = 0x3fffff < enabled_extensions_local._4_4_;
  local_12eb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1360,"VK_KHR_dynamic_rendering",&local_1361);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1360);
  std::__cxx11::string::~string(local_1360);
  std::allocator<char>::~allocator((allocator<char> *)&local_1361);
  if (((local_133a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->dynamic_rendering).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->dynamic_rendering;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->dynamic_rendering;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->dynamic_rendering).pNext;
  }
  local_138a = 0x3fffff < enabled_extensions_local._4_4_;
  local_133b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13b0,"VK_KHR_zero_initialize_workgroup_memory",&local_13b1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_13b0);
  std::__cxx11::string::~string(local_13b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13b1);
  if (((local_138a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->zero_initialize_workgroup_memory).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ZERO_INITIALIZE_WORKGROUP_MEMORY_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->zero_initialize_workgroup_memory;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->zero_initialize_workgroup_memory;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->zero_initialize_workgroup_memory).pNext;
  }
  local_13da = 0x3fffff < enabled_extensions_local._4_4_;
  local_138b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1400,"VK_EXT_transform_feedback",&local_1401);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1400);
  std::__cxx11::string::~string(local_1400);
  std::allocator<char>::~allocator((allocator<char> *)&local_1401);
  if (((local_13da & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->transform_feedback).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_TRANSFORM_FEEDBACK_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->transform_feedback;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->transform_feedback;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->transform_feedback).pNext;
  }
  local_142a = 0x3fffff < enabled_extensions_local._4_4_;
  local_13db = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1450,"VK_EXT_depth_clip_enable",&local_1451);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1450);
  std::__cxx11::string::~string(local_1450);
  std::allocator<char>::~allocator((allocator<char> *)&local_1451);
  if (((local_142a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->depth_clip).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLIP_ENABLE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->depth_clip;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->depth_clip;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->depth_clip).pNext;
  }
  local_147a = 0x3fffff < enabled_extensions_local._4_4_;
  local_142b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14a0,"VK_EXT_inline_uniform_block",&local_14a1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_14a0);
  std::__cxx11::string::~string(local_14a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14a1);
  if (((local_147a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->inline_uniform_block).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_INLINE_UNIFORM_BLOCK_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->inline_uniform_block;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->inline_uniform_block;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->inline_uniform_block).pNext;
  }
  local_14ca = 0x3fffff < enabled_extensions_local._4_4_;
  local_147b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14f0,"VK_EXT_blend_operation_advanced",&local_14f1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_14f0);
  std::__cxx11::string::~string(local_14f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f1);
  if (((local_14ca & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->blend_operation_advanced).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BLEND_OPERATION_ADVANCED_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->blend_operation_advanced;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->blend_operation_advanced;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->blend_operation_advanced).pNext;
  }
  local_151a = 0x3fffff < enabled_extensions_local._4_4_;
  local_14cb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1540,"VK_KHR_vertex_attribute_divisor",&local_1541);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1540);
  bVar3 = sVar2 != 0;
  std::__cxx11::string::~string(local_1540);
  std::allocator<char>::~allocator((allocator<char> *)&local_1541);
  local_151b = bVar3;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1568,"VK_EXT_vertex_attribute_divisor",&local_1569);
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c18,(key_type *)local_1568);
    local_151b = sVar2 != 0;
    std::__cxx11::string::~string(local_1568);
    std::allocator<char>::~allocator((allocator<char> *)&local_1569);
  }
  if (((local_151a & 1) != 0) && ((local_151b & 1) != 0)) {
    (pVStack_10->attribute_divisor).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_ATTRIBUTE_DIVISOR_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->attribute_divisor;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->attribute_divisor;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->attribute_divisor).pNext;
  }
  local_156a = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1590,"VK_EXT_shader_demote_to_helper_invocation",&local_1591);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1590);
  std::__cxx11::string::~string(local_1590);
  std::allocator<char>::~allocator((allocator<char> *)&local_1591);
  if (((local_156a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->demote_to_helper).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_DEMOTE_TO_HELPER_INVOCATION_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->demote_to_helper;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->demote_to_helper;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->demote_to_helper).pNext;
  }
  local_15ba = 0x3fffff < enabled_extensions_local._4_4_;
  local_156b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15e0,"VK_EXT_fragment_shader_interlock",&local_15e1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_15e0);
  std::__cxx11::string::~string(local_15e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15e1);
  if (((local_15ba & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_interlock).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADER_INTERLOCK_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_interlock;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_interlock;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_interlock).pNext;
  }
  local_160a = 0x3fffff < enabled_extensions_local._4_4_;
  local_15bb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1630,"VK_EXT_fragment_density_map",&local_1631);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1630);
  std::__cxx11::string::~string(local_1630);
  std::allocator<char>::~allocator((allocator<char> *)&local_1631);
  if (((local_160a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->fragment_density).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_DENSITY_MAP_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->fragment_density;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->fragment_density;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->fragment_density).pNext;
  }
  local_165a = 0x3fffff < enabled_extensions_local._4_4_;
  local_160b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1680,"VK_EXT_buffer_device_address",&local_1681);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1680);
  std::__cxx11::string::~string(local_1680);
  std::allocator<char>::~allocator((allocator<char> *)&local_1681);
  if (((local_165a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->buffer_device_address_ext).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_ADDRESS_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->buffer_device_address_ext;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->buffer_device_address_ext;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->buffer_device_address_ext).pNext;
  }
  local_16aa = 0x3fffff < enabled_extensions_local._4_4_;
  local_165b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16d0,"VK_KHR_line_rasterization",&local_16d1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_16d0);
  bVar3 = sVar2 != 0;
  std::__cxx11::string::~string(local_16d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16d1);
  local_16ab = bVar3;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_16f8,"VK_EXT_line_rasterization",&local_16f9);
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c18,(key_type *)local_16f8);
    local_16ab = sVar2 != 0;
    std::__cxx11::string::~string(local_16f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
  }
  if (((local_16aa & 1) != 0) && ((local_16ab & 1) != 0)) {
    (pVStack_10->line_rasterization).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_LINE_RASTERIZATION_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->line_rasterization;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->line_rasterization;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->line_rasterization).pNext;
  }
  local_16fa = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1720,"VK_EXT_subgroup_size_control",&local_1721);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1720);
  std::__cxx11::string::~string(local_1720);
  std::allocator<char>::~allocator((allocator<char> *)&local_1721);
  if (((local_16fa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->subgroup_size_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_SIZE_CONTROL_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->subgroup_size_control;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->subgroup_size_control;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->subgroup_size_control).pNext;
  }
  local_174a = 0x3fffff < enabled_extensions_local._4_4_;
  local_16fb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1770,"VK_EXT_extended_dynamic_state",&local_1771);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1770);
  std::__cxx11::string::~string(local_1770);
  std::allocator<char>::~allocator((allocator<char> *)&local_1771);
  if (((local_174a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->extended_dynamic_state).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->extended_dynamic_state;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->extended_dynamic_state;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->extended_dynamic_state).pNext;
  }
  local_179a = 0x3fffff < enabled_extensions_local._4_4_;
  local_174b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17c0,"VK_EXT_extended_dynamic_state2",&local_17c1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_17c0);
  std::__cxx11::string::~string(local_17c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17c1);
  if (((local_179a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->extended_dynamic_state2).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_2_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->extended_dynamic_state2;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->extended_dynamic_state2;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->extended_dynamic_state2).pNext;
  }
  local_17ea = 0x3fffff < enabled_extensions_local._4_4_;
  local_179b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1810,"VK_EXT_extended_dynamic_state3",&local_1811);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1810);
  std::__cxx11::string::~string(local_1810);
  std::allocator<char>::~allocator((allocator<char> *)&local_1811);
  if (((local_17ea & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->extended_dynamic_state3).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_3_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->extended_dynamic_state3;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->extended_dynamic_state3;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->extended_dynamic_state3).pNext;
  }
  local_183a = 0x3fffff < enabled_extensions_local._4_4_;
  local_17eb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1860,"VK_EXT_color_write_enable",&local_1861);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1860);
  std::__cxx11::string::~string(local_1860);
  std::allocator<char>::~allocator((allocator<char> *)&local_1861);
  if (((local_183a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->color_write_enable).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COLOR_WRITE_ENABLE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->color_write_enable;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->color_write_enable;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->color_write_enable).pNext;
  }
  local_188a = 0x3fffff < enabled_extensions_local._4_4_;
  local_183b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18b0,"VK_EXT_vertex_input_dynamic_state",&local_18b1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_18b0);
  std::__cxx11::string::~string(local_18b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18b1);
  if (((local_188a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->vertex_input_dynamic_state).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_INPUT_DYNAMIC_STATE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->vertex_input_dynamic_state;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->vertex_input_dynamic_state;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->vertex_input_dynamic_state).pNext;
  }
  local_18da = 0x3fffff < enabled_extensions_local._4_4_;
  local_188b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1900,"VK_EXT_shader_image_atomic_int64",&local_1901);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1900);
  std::__cxx11::string::~string(local_1900);
  std::allocator<char>::~allocator((allocator<char> *)&local_1901);
  if (((local_18da & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_image_atomic_int64).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_IMAGE_ATOMIC_INT64_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_image_atomic_int64;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_image_atomic_int64;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_image_atomic_int64).pNext;
  }
  local_192a = 0x3fffff < enabled_extensions_local._4_4_;
  local_18db = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1950,"VK_EXT_shader_atomic_float",&local_1951);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1950);
  std::__cxx11::string::~string(local_1950);
  std::allocator<char>::~allocator((allocator<char> *)&local_1951);
  if (((local_192a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_atomic_float).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_FLOAT_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_atomic_float;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_atomic_float;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_atomic_float).pNext;
  }
  local_197a = 0x3fffff < enabled_extensions_local._4_4_;
  local_192b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19a0,"VK_EXT_shader_atomic_float2",&local_19a1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_19a0);
  std::__cxx11::string::~string(local_19a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19a1);
  if (((local_197a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_atomic_float2).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_ATOMIC_FLOAT_2_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_atomic_float2;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_atomic_float2;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_atomic_float2).pNext;
  }
  local_19ca = 0x3fffff < enabled_extensions_local._4_4_;
  local_197b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19f0,"VK_EXT_provoking_vertex",&local_19f1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_19f0);
  std::__cxx11::string::~string(local_19f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19f1);
  if (((local_19ca & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->provoking_vertex).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROVOKING_VERTEX_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->provoking_vertex;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->provoking_vertex;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->provoking_vertex).pNext;
  }
  local_1a1a = 0x3fffff < enabled_extensions_local._4_4_;
  local_19cb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a40,"VK_EXT_custom_border_color",&local_1a41);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1a40);
  std::__cxx11::string::~string(local_1a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a41);
  if (((local_1a1a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->custom_border_color).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_CUSTOM_BORDER_COLOR_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->custom_border_color;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->custom_border_color;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->custom_border_color).pNext;
  }
  local_1a6a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1a1b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a90,"VK_KHR_compute_shader_derivatives",&local_1a91);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1a90);
  bVar3 = sVar2 != 0;
  std::__cxx11::string::~string(local_1a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a91);
  local_1a6b = bVar3;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ab8,"VK_NV_compute_shader_derivatives",&local_1ab9);
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c18,(key_type *)local_1ab8);
    local_1a6b = sVar2 != 0;
    std::__cxx11::string::~string(local_1ab8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ab9);
  }
  if (((local_1a6a & 1) != 0) && ((local_1a6b & 1) != 0)) {
    (pVStack_10->compute_shader_derivatives).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COMPUTE_SHADER_DERIVATIVES_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->compute_shader_derivatives;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->compute_shader_derivatives;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->compute_shader_derivatives).pNext;
  }
  local_1aba = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ae0,"VK_KHR_fragment_shader_barycentric",&local_1ae1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1ae0);
  std::__cxx11::string::~string(local_1ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ae1);
  if (((local_1aba & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->barycentric).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADER_BARYCENTRIC_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->barycentric;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->barycentric;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->barycentric).pNext;
  }
  local_1b0a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1abb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b30,"VK_NV_shader_image_footprint",&local_1b31);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1b30);
  std::__cxx11::string::~string(local_1b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b31);
  if (((local_1b0a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->image_footprint_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_IMAGE_FOOTPRINT_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->image_footprint_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->image_footprint_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->image_footprint_nv).pNext;
  }
  local_1b5a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1b0b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b80,"VK_NV_shading_rate_image",&local_1b81);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1b80);
  std::__cxx11::string::~string(local_1b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b81);
  if (((local_1b5a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shading_rate_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADING_RATE_IMAGE_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shading_rate_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shading_rate_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shading_rate_nv).pNext;
  }
  local_1baa = 0x3fffff < enabled_extensions_local._4_4_;
  local_1b5b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bd0,"VK_NV_cooperative_matrix",&local_1bd1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1bd0);
  std::__cxx11::string::~string(local_1bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bd1);
  if (((local_1baa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->cooperative_matrix_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COOPERATIVE_MATRIX_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->cooperative_matrix_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->cooperative_matrix_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->cooperative_matrix_nv).pNext;
  }
  local_1bfa = 0x3fffff < enabled_extensions_local._4_4_;
  local_1bab = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c20,"VK_NV_shader_sm_builtins",&local_1c21);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1c20);
  std::__cxx11::string::~string(local_1c20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c21);
  if (((local_1bfa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->sm_builtins_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SM_BUILTINS_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->sm_builtins_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->sm_builtins_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->sm_builtins_nv).pNext;
  }
  local_1c4a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1bfb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c70,"VK_INTEL_shader_integer_functions2",&local_1c71);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1c70);
  std::__cxx11::string::~string(local_1c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c71);
  if (((local_1c4a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->integer_functions2_intel).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_INTEGER_FUNCTIONS_2_FEATURES_INTEL;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->integer_functions2_intel;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->integer_functions2_intel;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->integer_functions2_intel).pNext;
  }
  local_1c9a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1c4b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cc0,"VK_EXT_mutable_descriptor_type",&local_1cc1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1cc0);
  bVar3 = sVar2 != 0;
  std::__cxx11::string::~string(local_1cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cc1);
  local_1c9b = bVar3;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ce8,"VK_VALVE_mutable_descriptor_type",&local_1ce9);
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c18,(key_type *)local_1ce8);
    local_1c9b = sVar2 != 0;
    std::__cxx11::string::~string(local_1ce8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ce9);
  }
  if (((local_1c9a & 1) != 0) && ((local_1c9b & 1) != 0)) {
    (pVStack_10->mutable_descriptor_type).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->mutable_descriptor_type;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->mutable_descriptor_type;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->mutable_descriptor_type).pNext;
  }
  local_1cea = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d10,"VK_EXT_robustness2",&local_1d11);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1d10);
  std::__cxx11::string::~string(local_1d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d11);
  if (((local_1cea & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->robustness2).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->robustness2;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->robustness2;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->robustness2).pNext;
  }
  local_1d3a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1ceb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d60,"VK_EXT_image_robustness",&local_1d61);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1d60);
  std::__cxx11::string::~string(local_1d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d61);
  if (((local_1d3a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->image_robustness).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->image_robustness;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->image_robustness;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->image_robustness).pNext;
  }
  local_1d8a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1d3b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1db0,"VK_EXT_graphics_pipeline_library",&local_1db1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1db0);
  std::__cxx11::string::~string(local_1db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1db1);
  if (((local_1d8a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->graphics_pipeline_library).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_GRAPHICS_PIPELINE_LIBRARY_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->graphics_pipeline_library;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->graphics_pipeline_library;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->graphics_pipeline_library).pNext;
  }
  local_1dda = 0x3fffff < enabled_extensions_local._4_4_;
  local_1d8b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e00,"VK_NV_fragment_shading_rate_enums",&local_1e01);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1e00);
  std::__cxx11::string::~string(local_1e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e01);
  if (((local_1dda & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->fragment_shading_rate_enums).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->fragment_shading_rate_enums;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->fragment_shading_rate_enums;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->fragment_shading_rate_enums).pNext;
  }
  local_1e2a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1ddb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e50,"VK_EXT_depth_clip_control",&local_1e51);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1e50);
  std::__cxx11::string::~string(local_1e50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e51);
  if (((local_1e2a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->depth_clip_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLIP_CONTROL_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->depth_clip_control;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->depth_clip_control;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->depth_clip_control).pNext;
  }
  local_1e7a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1e2b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ea0,"VK_NV_mesh_shader",&local_1ea1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1ea0);
  std::__cxx11::string::~string(local_1ea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ea1);
  if (((local_1e7a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->mesh_shader_nv).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->mesh_shader_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->mesh_shader_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->mesh_shader_nv).pNext;
  }
  local_1eca = 0x3fffff < enabled_extensions_local._4_4_;
  local_1e7b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ef0,"VK_EXT_mesh_shader",&local_1ef1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1ef0);
  std::__cxx11::string::~string(local_1ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ef1);
  if (((local_1eca & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->mesh_shader).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->mesh_shader;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->mesh_shader;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->mesh_shader).pNext;
  }
  local_1f1a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1ecb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f40,"VK_EXT_descriptor_buffer",&local_1f41);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1f40);
  std::__cxx11::string::~string(local_1f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f41);
  if (((local_1f1a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->descriptor_buffer).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->descriptor_buffer;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->descriptor_buffer;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->descriptor_buffer).pNext;
  }
  local_1f6a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1f1b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f90,"VK_EXT_non_seamless_cube_map",&local_1f91);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1f90);
  std::__cxx11::string::~string(local_1f90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f91);
  if (((local_1f6a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->non_seamless_cube_map).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_NON_SEAMLESS_CUBE_MAP_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->non_seamless_cube_map;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->non_seamless_cube_map;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->non_seamless_cube_map).pNext;
  }
  local_1fba = 0x3fffff < enabled_extensions_local._4_4_;
  local_1f6b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fe0,"VK_EXT_attachment_feedback_loop_layout",&local_1fe1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_1fe0);
  std::__cxx11::string::~string(local_1fe0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fe1);
  if (((local_1fba & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->attachment_feedback_loop_layout).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ATTACHMENT_FEEDBACK_LOOP_LAYOUT_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->attachment_feedback_loop_layout;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->attachment_feedback_loop_layout;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->attachment_feedback_loop_layout).pNext;
  }
  local_200a = 0x3fffff < enabled_extensions_local._4_4_;
  local_1fbb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2030,"VK_KHR_maintenance4",&local_2031);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2030);
  std::__cxx11::string::~string(local_2030);
  std::allocator<char>::~allocator((allocator<char> *)&local_2031);
  if (((local_200a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->maintenance4).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_4_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->maintenance4;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->maintenance4;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->maintenance4).pNext
    ;
  }
  local_205a = 0x3fffff < enabled_extensions_local._4_4_;
  local_200b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2080,"VK_KHR_maintenance5",&local_2081);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2080);
  std::__cxx11::string::~string(local_2080);
  std::allocator<char>::~allocator((allocator<char> *)&local_2081);
  if (((local_205a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->maintenance5).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_5_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->maintenance5;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->maintenance5;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->maintenance5).pNext
    ;
  }
  local_20aa = 0x3fffff < enabled_extensions_local._4_4_;
  local_205b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20d0,"VK_KHR_maintenance7",&local_20d1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_20d0);
  std::__cxx11::string::~string(local_20d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_20d1);
  if (((local_20aa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->maintenance7).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_7_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->maintenance7;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->maintenance7;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->maintenance7).pNext
    ;
  }
  local_20fa = 0x3fffff < enabled_extensions_local._4_4_;
  local_20ab = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2120,"VK_EXT_shader_module_identifier",&local_2121);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2120);
  std::__cxx11::string::~string(local_2120);
  std::allocator<char>::~allocator((allocator<char> *)&local_2121);
  if (((local_20fa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_module_identifier).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_module_identifier;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_module_identifier;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_module_identifier).pNext;
  }
  local_214a = 0x3fffff < enabled_extensions_local._4_4_;
  local_20fb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2170,"VK_KHR_ray_tracing_maintenance1",&local_2171);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2170);
  std::__cxx11::string::~string(local_2170);
  std::allocator<char>::~allocator((allocator<char> *)&local_2171);
  if (((local_214a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->ray_tracing_maintenance1).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_MAINTENANCE_1_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ray_tracing_maintenance1;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ray_tracing_maintenance1;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->ray_tracing_maintenance1).pNext;
  }
  local_219a = 0x3fffff < enabled_extensions_local._4_4_;
  local_214b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_21c0,"VK_NV_ray_tracing_motion_blur",&local_21c1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_21c0);
  std::__cxx11::string::~string(local_21c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_21c1);
  if (((local_219a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->ray_tracing_motion_blur_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_MOTION_BLUR_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ray_tracing_motion_blur_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ray_tracing_motion_blur_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->ray_tracing_motion_blur_nv).pNext;
  }
  local_21ea = 0x3fffff < enabled_extensions_local._4_4_;
  local_219b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2210,"VK_QCOM_image_processing",&local_2211);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2210);
  std::__cxx11::string::~string(local_2210);
  std::allocator<char>::~allocator((allocator<char> *)&local_2211);
  if (((local_21ea & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->image_processing_qcom).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_PROCESSING_FEATURES_QCOM;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->image_processing_qcom;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->image_processing_qcom;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->image_processing_qcom).pNext;
  }
  local_223a = 0x3fffff < enabled_extensions_local._4_4_;
  local_21eb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2260,"VK_QCOM_image_processing2",&local_2261);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2260);
  std::__cxx11::string::~string(local_2260);
  std::allocator<char>::~allocator((allocator<char> *)&local_2261);
  if (((local_223a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->image_processing2_qcom).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_PROCESSING_2_FEATURES_QCOM;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->image_processing2_qcom;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->image_processing2_qcom;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->image_processing2_qcom).pNext;
  }
  local_228a = 0x3fffff < enabled_extensions_local._4_4_;
  local_223b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_22b0,"VK_ARM_shader_core_builtins",&local_22b1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_22b0);
  std::__cxx11::string::~string(local_22b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22b1);
  if (((local_228a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_core_builtins_arm).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_CORE_BUILTINS_FEATURES_ARM;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_core_builtins_arm;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_core_builtins_arm;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_core_builtins_arm).pNext;
  }
  local_22da = 0x3fffff < enabled_extensions_local._4_4_;
  local_228b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2300,"VK_KHR_ray_tracing_position_fetch",&local_2301);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2300);
  std::__cxx11::string::~string(local_2300);
  std::allocator<char>::~allocator((allocator<char> *)&local_2301);
  if (((local_22da & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->ray_tracing_position_fetch).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_POSITION_FETCH_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ray_tracing_position_fetch;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ray_tracing_position_fetch;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->ray_tracing_position_fetch).pNext;
  }
  local_232a = 0x3fffff < enabled_extensions_local._4_4_;
  local_22db = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2350,"VK_EXT_shader_tile_image",&local_2351);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2350);
  std::__cxx11::string::~string(local_2350);
  std::allocator<char>::~allocator((allocator<char> *)&local_2351);
  if (((local_232a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_tile_image).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_TILE_IMAGE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_tile_image;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_tile_image;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_tile_image).pNext;
  }
  local_237a = 0x3fffff < enabled_extensions_local._4_4_;
  local_232b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_23a0,"VK_KHR_cooperative_matrix",&local_23a1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_23a0);
  std::__cxx11::string::~string(local_23a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_23a1);
  if (((local_237a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->cooperative_matrix).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_COOPERATIVE_MATRIX_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->cooperative_matrix;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->cooperative_matrix;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->cooperative_matrix).pNext;
  }
  local_23ca = 0x3fffff < enabled_extensions_local._4_4_;
  local_237b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_23f0,"VK_KHR_shader_subgroup_rotate",&local_23f1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_23f0);
  std::__cxx11::string::~string(local_23f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_23f1);
  if (((local_23ca & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_subgroup_rotate).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_SUBGROUP_ROTATE_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_subgroup_rotate;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_subgroup_rotate;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_subgroup_rotate).pNext;
  }
  local_241a = 0x3fffff < enabled_extensions_local._4_4_;
  local_23cb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2440,"VK_KHR_shader_expect_assume",&local_2441);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2440);
  std::__cxx11::string::~string(local_2440);
  std::allocator<char>::~allocator((allocator<char> *)&local_2441);
  if (((local_241a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->expect_assume).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_EXPECT_ASSUME_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->expect_assume;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->expect_assume;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->expect_assume).pNext;
  }
  local_246a = 0x3fffff < enabled_extensions_local._4_4_;
  local_241b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2490,"VK_KHR_shader_float_controls2",&local_2491);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2490);
  std::__cxx11::string::~string(local_2490);
  std::allocator<char>::~allocator((allocator<char> *)&local_2491);
  if (((local_246a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_float_controls2).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_FLOAT_CONTROLS_2_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_float_controls2;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_float_controls2;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_float_controls2).pNext;
  }
  local_24ba = 0x3fffff < enabled_extensions_local._4_4_;
  local_246b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_24e0,"VK_KHR_shader_quad_control",&local_24e1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_24e0);
  std::__cxx11::string::~string(local_24e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24e1);
  if (((local_24ba & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_quad_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_QUAD_CONTROL_FEATURES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_quad_control;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_quad_control;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_quad_control).pNext;
  }
  local_250a = 0x3fffff < enabled_extensions_local._4_4_;
  local_24bb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2530,"VK_NV_raw_access_chains",&local_2531);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2530);
  std::__cxx11::string::~string(local_2530);
  std::allocator<char>::~allocator((allocator<char> *)&local_2531);
  if (((local_250a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->raw_access_chains_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAW_ACCESS_CHAINS_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->raw_access_chains_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->raw_access_chains_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->raw_access_chains_nv).pNext;
  }
  local_255a = 0x3fffff < enabled_extensions_local._4_4_;
  local_250b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2580,"VK_EXT_shader_replicated_composites",&local_2581);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2580);
  std::__cxx11::string::~string(local_2580);
  std::allocator<char>::~allocator((allocator<char> *)&local_2581);
  if (((local_255a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_replicated_composites).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_REPLICATED_COMPOSITES_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_replicated_composites;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_replicated_composites;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_replicated_composites).pNext;
  }
  local_25aa = 0x3fffff < enabled_extensions_local._4_4_;
  local_255b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_25d0,"VK_EXT_pipeline_robustness",&local_25d1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_25d0);
  std::__cxx11::string::~string(local_25d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_25d1);
  if (((local_25aa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->pipeline_robustness).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_ROBUSTNESS_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->pipeline_robustness;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->pipeline_robustness;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->pipeline_robustness).pNext;
  }
  local_25fa = 0x3fffff < enabled_extensions_local._4_4_;
  local_25ab = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2620,"VK_EXT_conditional_rendering",&local_2621);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2620);
  std::__cxx11::string::~string(local_2620);
  std::allocator<char>::~allocator((allocator<char> *)&local_2621);
  if (((local_25fa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->conditional_rendering).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_CONDITIONAL_RENDERING_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->conditional_rendering;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->conditional_rendering;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->conditional_rendering).pNext;
  }
  local_264a = 0x3fffff < enabled_extensions_local._4_4_;
  local_25fb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2670,"VK_KHR_dynamic_rendering_local_read",&local_2671);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2670);
  std::__cxx11::string::~string(local_2670);
  std::allocator<char>::~allocator((allocator<char> *)&local_2671);
  if (((local_264a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->dynamic_rendering_local_read).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_LOCAL_READ_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->dynamic_rendering_local_read;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->dynamic_rendering_local_read;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->dynamic_rendering_local_read).pNext;
  }
  local_269a = 0x3fffff < enabled_extensions_local._4_4_;
  local_264b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_26c0,"VK_EXT_rasterization_order_attachment_access",&local_26c1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_26c0);
  bVar3 = sVar2 != 0;
  std::__cxx11::string::~string(local_26c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_26c1);
  local_269b = bVar3;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_26e8,"VK_ARM_rasterization_order_attachment_access",&local_26e9);
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c18,(key_type *)local_26e8);
    local_269b = sVar2 != 0;
    std::__cxx11::string::~string(local_26e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_26e9);
  }
  if (((local_269a & 1) != 0) && ((local_269b & 1) != 0)) {
    (pVStack_10->rasterization_order_attachment_access).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_FEATURES_ARM;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->rasterization_order_attachment_access;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->rasterization_order_attachment_access;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->rasterization_order_attachment_access).pNext;
  }
  local_26ea = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2710,"VK_NV_device_generated_commands",&local_2711);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2710);
  std::__cxx11::string::~string(local_2710);
  std::allocator<char>::~allocator((allocator<char> *)&local_2711);
  if (((local_26ea & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->device_generated_commands_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->device_generated_commands_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->device_generated_commands_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->device_generated_commands_nv).pNext;
  }
  local_273a = 0x3fffff < enabled_extensions_local._4_4_;
  local_26eb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2760,"VK_NV_device_generated_commands_compute",&local_2761);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2760);
  std::__cxx11::string::~string(local_2760);
  std::allocator<char>::~allocator((allocator<char> *)&local_2761);
  if (((local_273a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->device_generated_commands_compute_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_COMPUTE_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->device_generated_commands_compute_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->device_generated_commands_compute_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->device_generated_commands_compute_nv).pNext;
  }
  local_278a = 0x3fffff < enabled_extensions_local._4_4_;
  local_273b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_27b0,"VK_NV_optical_flow",&local_27b1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_27b0);
  std::__cxx11::string::~string(local_27b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b1);
  if (((local_278a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->optical_flow_nv).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_OPTICAL_FLOW_FEATURES_NV
    ;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->optical_flow_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->optical_flow_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->optical_flow_nv).pNext;
  }
  local_27da = 0x3fffff < enabled_extensions_local._4_4_;
  local_278b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2800,"VK_EXT_legacy_dithering",&local_2801);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2800);
  std::__cxx11::string::~string(local_2800);
  std::allocator<char>::~allocator((allocator<char> *)&local_2801);
  if (((local_27da & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->legacy_dithering).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_LEGACY_DITHERING_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->legacy_dithering;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->legacy_dithering;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->legacy_dithering).pNext;
  }
  local_282a = 0x3fffff < enabled_extensions_local._4_4_;
  local_27db = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2850,"VK_EXT_pipeline_protected_access",&local_2851);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2850);
  std::__cxx11::string::~string(local_2850);
  std::allocator<char>::~allocator((allocator<char> *)&local_2851);
  if (((local_282a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->pipeline_protected_access).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_PROTECTED_ACCESS_FEATURES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->pipeline_protected_access;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->pipeline_protected_access;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->pipeline_protected_access).pNext;
  }
  local_287a = 0x3fffff < enabled_extensions_local._4_4_;
  local_282b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28a0,"VK_NV_per_stage_descriptor_set",&local_28a1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_28a0);
  std::__cxx11::string::~string(local_28a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28a1);
  if (((local_287a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->per_stage_descriptor_set_nv).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PER_STAGE_DESCRIPTOR_SET_FEATURES_NV;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->per_stage_descriptor_set_nv;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->per_stage_descriptor_set_nv;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->per_stage_descriptor_set_nv).pNext;
  }
  local_28ca = 0x3fffff < enabled_extensions_local._4_4_;
  local_287b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28f0,"VK_EXT_attachment_feedback_loop_dynamic_state",&local_28f1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_28f0);
  std::__cxx11::string::~string(local_28f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28f1);
  if (((local_28ca & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->attachment_feedback_loop_dynamic_state).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ATTACHMENT_FEEDBACK_LOOP_DYNAMIC_STATE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->attachment_feedback_loop_dynamic_state;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->attachment_feedback_loop_dynamic_state;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->attachment_feedback_loop_dynamic_state).pNext;
  }
  local_291a = 0x3fffff < enabled_extensions_local._4_4_;
  local_28cb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2940,"VK_EXT_subpass_merge_feedback",&local_2941);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2940);
  std::__cxx11::string::~string(local_2940);
  std::allocator<char>::~allocator((allocator<char> *)&local_2941);
  if (((local_291a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->subpass_merge_feedback).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBPASS_MERGE_FEEDBACK_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->subpass_merge_feedback;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->subpass_merge_feedback;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->subpass_merge_feedback).pNext;
  }
  local_296a = 0x3fffff < enabled_extensions_local._4_4_;
  local_291b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2990,"VK_EXT_border_color_swizzle",&local_2991);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2990);
  std::__cxx11::string::~string(local_2990);
  std::allocator<char>::~allocator((allocator<char> *)&local_2991);
  if (((local_296a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->border_color_swizzle).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BORDER_COLOR_SWIZZLE_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->border_color_swizzle;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->border_color_swizzle;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->border_color_swizzle).pNext;
  }
  local_29ba = 0x3fffff < enabled_extensions_local._4_4_;
  local_296b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_29e0,"VK_EXT_multisampled_render_to_single_sampled",&local_29e1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_29e0);
  std::__cxx11::string::~string(local_29e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_29e1);
  if (((local_29ba & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->multisampled_render_to_single_sampled).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->multisampled_render_to_single_sampled;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->multisampled_render_to_single_sampled;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->multisampled_render_to_single_sampled).pNext;
  }
  local_2a0a = 0x3fffff < enabled_extensions_local._4_4_;
  local_29bb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a30,"VK_EXT_depth_bias_control",&local_2a31);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2a30);
  std::__cxx11::string::~string(local_2a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a31);
  if (((local_2a0a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->depth_bias_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_BIAS_CONTROL_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->depth_bias_control;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->depth_bias_control;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->depth_bias_control).pNext;
  }
  local_2a5a = 0x3fffff < enabled_extensions_local._4_4_;
  local_2a0b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a80,"VK_EXT_depth_clamp_control",&local_2a81);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2a80);
  std::__cxx11::string::~string(local_2a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a81);
  if (((local_2a5a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->depth_clamp_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_CLAMP_CONTROL_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->depth_clamp_control;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->depth_clamp_control;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->depth_clamp_control).pNext;
  }
  local_2aaa = 0x3fffff < enabled_extensions_local._4_4_;
  local_2a5b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2ad0,"VK_EXT_device_generated_commands",&local_2ad1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2ad0);
  std::__cxx11::string::~string(local_2ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ad1);
  if (((local_2aaa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->device_generated_commands).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEVICE_GENERATED_COMMANDS_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->device_generated_commands;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->device_generated_commands;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->device_generated_commands).pNext;
  }
  local_2afa = 0x3fffff < enabled_extensions_local._4_4_;
  local_2aab = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b20,"VK_EXT_shader_object",&local_2b21);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2b20);
  std::__cxx11::string::~string(local_2b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b21);
  if (((local_2afa & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->shader_object).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT
    ;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_object;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_object;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_object).pNext;
  }
  local_2b4a = 0x3fffff < enabled_extensions_local._4_4_;
  local_2afb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b70,"VK_EXT_primitives_generated_query",&local_2b71);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2b70);
  std::__cxx11::string::~string(local_2b70);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b71);
  if (((local_2b4a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->primitives_generated_query).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->primitives_generated_query;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->primitives_generated_query;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->primitives_generated_query).pNext;
  }
  local_2b9a = 0x3fffff < enabled_extensions_local._4_4_;
  local_2b4b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2bc0,"VK_EXT_image_2d_view_of_3d",&local_2bc1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2bc0);
  std::__cxx11::string::~string(local_2bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bc1);
  if (((local_2b9a & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->image_2d_view_of_3d).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->image_2d_view_of_3d;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->image_2d_view_of_3d;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->image_2d_view_of_3d).pNext;
  }
  local_2bea = 0x3fffff < enabled_extensions_local._4_4_;
  local_2b9b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c10,"VK_EXT_opacity_micromap",&local_2c11);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18,(key_type *)local_2c10);
  std::__cxx11::string::~string(local_2c10);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c11);
  if (((local_2bea & 1) != 0) && (sVar2 != 0)) {
    (pVStack_10->opacity_micromap).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_OPACITY_MICROMAP_FEATURES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->opacity_micromap;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->opacity_micromap;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->opacity_micromap).pNext;
  }
  local_2beb = sVar2 != 0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c18);
  return ppNext;
}

Assistant:

void *build_pnext_chain(VulkanFeatures &features, uint32_t api_version,
                        const char **enabled_extensions, uint32_t extension_count)
{
	features = {};
	void *pNext = nullptr;
	void **ppNext = nullptr;

	std::unordered_set<std::string> enabled_extension_set;
	for (uint32_t i = 0; i < extension_count; i++)
		enabled_extension_set.insert(enabled_extensions[i]);

#define CHAIN(struct_type, member, min_api_version, required_extension, required_extension_alias) \
	do { \
        bool is_minimum_api_version = api_version >= min_api_version; \
		bool supports_extension = enabled_extension_set.count(required_extension) != 0; \
        if (!supports_extension && required_extension_alias) \
			supports_extension = enabled_extension_set.count(required_extension_alias) != 0; \
		if (is_minimum_api_version && supports_extension) { \
			member.sType = struct_type; \
			if (!pNext) pNext = &member; \
			if (ppNext) *ppNext = &member; \
			ppNext = &member.pNext; \
		} \
	} while (0)

#define F(struct_type, member, minimum_api_version, required_extension) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES, features.member, \
	VK_API_VERSION_##minimum_api_version, VK_##required_extension##_EXTENSION_NAME, nullptr)
#define FE(struct_type, member, ext) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext, features.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, nullptr)
#define FE_ALIAS(struct_type, member, ext, ext_alias) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext, features.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, VK_##ext_alias##_##struct_type##_EXTENSION_NAME)

#include "fossilize_feature_filter_features.inc"

#undef CHAIN
#undef F
#undef FE
#undef FE_ALIAS

	return pNext;
}